

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O2

void __thiscall cnn::Device::~Device(Device *this)

{
  ~Device(this);
  operator_delete(this);
  return;
}

Assistant:

Device::~Device() {}